

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

bool __thiscall Graph::is_all_visited(Graph *this)

{
  int i;
  Graph *this_local;
  
  i = 1;
  while( true ) {
    if (this->num_node <= i) {
      return true;
    }
    if ((this->nodes[i].visited & 1U) == 0) break;
    i = i + 1;
  }
  return false;
}

Assistant:

bool Graph::is_all_visited() const
{
	for(int i = 1; i < num_node; i++){
		if(!nodes[i].visited){
			return false;
		}
	}
	return true;
}